

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_fix_softlocks.hpp
# Opt level: O3

void PatchFixSoftlocks::fix_fara_arena_chest_softlock(ROM *rom,World *world)

{
  _func_int **pp_Var1;
  pointer ppEVar2;
  Entity *pEVar3;
  uint32_t uVar4;
  mapped_type *ppMVar5;
  Code *pCVar6;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  Code func;
  allocator_type local_1da;
  allocator_type local_1d9;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1d8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_1c0;
  undefined1 local_1a8 [24];
  undefined1 auStack_190 [8];
  _Rb_tree_node_base local_188;
  undefined **local_168;
  undefined1 auStack_160 [8];
  _Rb_tree_node_base local_158;
  undefined **local_138;
  undefined1 local_130;
  Code local_128;
  AddressRegister local_b0;
  AddressRegister local_a0;
  undefined **local_90;
  undefined1 local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined **local_60;
  undefined1 local_58;
  undefined **local_50;
  undefined1 local_48;
  undefined **local_40;
  undefined1 local_38;
  
  local_1a8._0_2_ = 0x1c;
  ppMVar5 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&world->_maps,(key_type *)local_1a8);
  ppEVar2 = ((*ppMVar5)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0xe < (ulong)((long)((*ppMVar5)->_entities).
                          super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3)) {
    pEVar3 = ppEVar2[0xe];
    (pEVar3->_attrs).position.x = '\x1a';
    (pEVar3->_attrs).position.y = '\x13';
    (pEVar3->_attrs).position.z = '\x04';
    (pEVar3->_attrs).behavior_id = 0;
    local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
    local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header;
    local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_128._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = &PTR_getXn_00262be0;
    auStack_190[0] = 1;
    local_1a8._16_8_ = &PTR_getXn_00262be0;
    local_188._M_parent = (_Base_ptr)CONCAT71(local_188._M_parent._1_7_,2);
    local_188._0_8_ = &PTR_getXn_00262be0;
    local_188._M_right = (_Base_ptr)CONCAT71(local_188._M_right._1_7_,3);
    local_188._M_left = (_Base_ptr)&PTR_getXn_00262be0;
    auStack_160[0] = 4;
    local_168 = &PTR_getXn_00262be0;
    local_158._M_parent = (_Base_ptr)CONCAT71(local_158._M_parent._1_7_,5);
    local_158._0_8_ = &PTR_getXn_00262be0;
    local_158._M_right = (_Base_ptr)CONCAT71(local_158._M_right._1_7_,6);
    local_158._M_left = (_Base_ptr)&PTR_getXn_00262be0;
    local_130 = 7;
    local_138 = &PTR_getXn_00262be0;
    __l._M_len = 8;
    __l._M_array = (iterator)local_1a8;
    local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
              (&local_1c0,__l,&local_1d9);
    local_a0.super_Register._8_8_ = local_a0.super_Register._8_8_ & 0xffffffffffffff00;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    local_88 = 1;
    local_90 = &PTR_getXn_00262c50;
    local_78 = 2;
    local_80 = &PTR_getXn_00262c50;
    local_68 = 3;
    local_70 = &PTR_getXn_00262c50;
    local_58 = 4;
    local_60 = &PTR_getXn_00262c50;
    local_48 = 5;
    local_50 = &PTR_getXn_00262c50;
    local_38 = 6;
    local_40 = &PTR_getXn_00262c50;
    __l_00._M_len = 7;
    __l_00._M_array = &local_a0;
    std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
              (&local_1d8,__l_00,&local_1da);
    local_b0.super_Register._code = '\a';
    local_b0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    md::Code::movem(&local_128,&local_1c0,&local_1d8,true,&local_b0,LONG);
    if (local_1d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c0.
                      super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c0.
                            super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.
                            super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_a0.super_Register._8_8_ = local_a0.super_Register._8_8_ & 0xffffffffffffff00;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    local_1a8._0_8_ = &PTR_getXn_00262cd8;
    local_1a8._8_8_ = (pointer)0x200ff5480;
    md::Code::lea(&local_128,(Param *)local_1a8,&local_a0);
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = &PTR_getXn_00262be0;
    md::Code::moveq(&local_128,'\r',(DataRegister *)local_1a8);
    pp_Var1 = (_func_int **)(local_1a8 + 0x10);
    local_1a8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"loop_remove_entities","");
    md::Code::label(&local_128,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = &PTR_getXn_00262d18;
    local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
    local_1a8._8_8_ = &PTR_getXn_00262c50;
    auStack_190._0_3_ = 0x20000;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c98;
    local_a0.super_Register._8_8_ = 0x100007f7f;
    md::Code::move(&local_128,(Param *)&local_a0,(Param *)local_1a8,WORD);
    local_a0.super_Register._8_8_ = local_a0.super_Register._8_8_ & 0xffffffffffffff00;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    local_1a8._0_8_ = &PTR_getXn_00262c98;
    local_1a8._8_8_ = (pointer)0x200000080;
    md::Code::adda(&local_128,(Param *)local_1a8,&local_a0);
    local_a0.super_Register._8_8_ = local_a0.super_Register._8_8_ & 0xffffffffffffff00;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
    local_1a8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"loop_remove_entities","");
    md::Code::dbra(&local_128,(DataRegister *)&local_a0,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffffffffff00;
    local_1a8._0_8_ = &PTR_getXn_00262be0;
    auStack_190[0] = 1;
    local_1a8._16_8_ = &PTR_getXn_00262be0;
    local_188._M_parent = (_Base_ptr)CONCAT71(local_188._M_parent._1_7_,2);
    local_188._0_8_ = &PTR_getXn_00262be0;
    local_188._M_right = (_Base_ptr)CONCAT71(local_188._M_right._1_7_,3);
    local_188._M_left = (_Base_ptr)&PTR_getXn_00262be0;
    auStack_160[0] = 4;
    local_168 = &PTR_getXn_00262be0;
    local_158._M_parent = (_Base_ptr)CONCAT71(local_158._M_parent._1_7_,5);
    local_158._0_8_ = &PTR_getXn_00262be0;
    local_158._M_right = (_Base_ptr)CONCAT71(local_158._M_right._1_7_,6);
    local_158._M_left = (_Base_ptr)&PTR_getXn_00262be0;
    local_130 = 7;
    local_138 = &PTR_getXn_00262be0;
    __l_01._M_len = 8;
    __l_01._M_array = (iterator)local_1a8;
    std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
              (&local_1c0,__l_01,&local_1d9);
    local_a0.super_Register._8_8_ = local_a0.super_Register._8_8_ & 0xffffffffffffff00;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    local_88 = 1;
    local_90 = &PTR_getXn_00262c50;
    local_78 = 2;
    local_80 = &PTR_getXn_00262c50;
    local_68 = 3;
    local_70 = &PTR_getXn_00262c50;
    local_58 = 4;
    local_60 = &PTR_getXn_00262c50;
    local_48 = 5;
    local_50 = &PTR_getXn_00262c50;
    local_38 = 6;
    local_40 = &PTR_getXn_00262c50;
    __l_02._M_len = 7;
    __l_02._M_array = &local_a0;
    std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
              (&local_1d8,__l_02,&local_1da);
    local_b0.super_Register._code = '\a';
    local_b0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
    md::Code::movem(&local_128,&local_1c0,&local_1d8,false,&local_b0,LONG);
    if (local_1d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1c0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c0.
                      super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c0.
                            super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c0.
                            super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    md::Code::rts(&local_128);
    local_1a8._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    uVar4 = md::ROM::inject_code(rom,&local_128,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_188._M_left = &local_188;
    local_158._M_parent = (_Base_ptr)0x0;
    local_168 = (undefined **)0x0;
    auStack_160 = (undefined1  [8])0x0;
    local_188._M_color = _S_red;
    local_188._4_4_ = 0;
    local_188._M_parent = (_Base_ptr)0x0;
    local_1a8._16_8_ = 0;
    auStack_190 = (undefined1  [8])0x0;
    local_1a8._0_8_ = (_func_int **)0x0;
    local_1a8._8_8_ = (pointer)0x0;
    local_158._M_left = &local_158;
    local_158._M_color = _S_red;
    local_158._4_4_ = 0;
    local_138 = (undefined **)0x0;
    local_a0.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
    local_a0.super_Register._12_4_ = 2;
    local_a0.super_Register._8_4_ = uVar4;
    local_188._M_right = local_188._M_left;
    local_158._M_right = local_158._M_left;
    pCVar6 = md::Code::jsr((Code *)local_1a8,(Param *)&local_a0);
    pCVar6 = md::Code::nop(pCVar6,1);
    md::ROM::set_code(rom,0x19be0,pCVar6);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)auStack_160);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_190);
    if ((_func_int **)local_1a8._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_128._labels._M_t);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_128._pending_branches._M_t);
    if (local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128._bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128._bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0xe);
}

Assistant:

static void fix_fara_arena_chest_softlock(md::ROM& rom, const World& world)
    {
        // Move the chest to the ground
        Entity* chest = world.map(MAP_SWAMP_SHRINE_BOSS_ROOM)->entity(14);
        chest->position(26, 19, 4);
        chest->behavior_id(0);

        // Function to remove all entities but the chest when coming back in the room
        md::Code func;
        func.movem_to_stack({ reg_D0_D7 }, { reg_A0_A6 });
        {
            func.lea(0xFF5480, reg_A0);
            func.moveq(0xD, reg_D0);
            func.label("loop_remove_entities");
            {
                func.movew(0x7F7F, addr_(reg_A0));
                func.adda(0x80, reg_A0);
            }
            func.dbra(reg_D0, "loop_remove_entities");
        }
        func.movem_from_stack({ reg_D0_D7 }, { reg_A0_A6 });
        func.rts();

        uint32_t addr = rom.inject_code(func);

        // Call the injected function
        rom.set_code(0x019BE0, md::Code().jsr(addr).nop());
    }